

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
RPCExamples::ToDescriptionString_abi_cxx11_(string *__return_storage_ptr__,RPCExamples *this)

{
  long in_FS_OFFSET;
  
  if ((this->m_examples)._M_string_length == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) goto LAB_005b7d21;
    std::__cxx11::string::string((string *)__return_storage_ptr__,&this->m_examples);
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
LAB_005b7d21:
      __stack_chk_fail();
    }
    std::operator+(__return_storage_ptr__,"\nExamples:\n",&this->m_examples);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RPCExamples::ToDescriptionString() const
{
    return m_examples.empty() ? m_examples : "\nExamples:\n" + m_examples;
}